

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *slot;
  char *token;
  char *serial;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  CK_C_GetFunctionList p_Var10;
  CK_RV CVar11;
  Configuration *this;
  undefined7 extraout_var;
  int iVar12;
  char *pcVar13;
  string sStackY_1d8;
  string sStackY_1b8;
  string sStackY_198;
  string sStackY_178;
  Directory DStackY_158;
  ulong uStackY_f0;
  int local_cc;
  char *local_c8;
  char *local_c0;
  char *local_a8;
  char *local_a0;
  CK_SLOT_ID slotID;
  undefined8 local_88;
  char *local_80;
  int option_index;
  undefined8 local_70;
  char *local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *errMsg;
  
  option_index = 0;
  errMsg = (char *)0x0;
  slotID = 0;
  moduleHandle = (void *)0x0;
  p11 = (CK_FUNCTION_LIST_PTR)0x0;
  local_c8 = (char *)0x0;
  local_68 = (char *)0x0;
  local_c0 = (char *)0x0;
  local_80 = (char *)0x0;
  local_a0 = (char *)0x0;
  local_50 = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_88 = 0;
  local_58 = 0;
  local_70 = 0;
  bVar5 = false;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_cc = 0;
  bVar6 = false;
  local_60 = (char *)0x0;
  local_a8 = (char *)0x0;
  iVar9 = 0;
switchD_00111f69_caseD_114:
  iVar12 = iVar9;
  iVar7 = getopt_long((ulong)(uint)argc,argv,"hv",long_options,&option_index);
  serial = local_40;
  token = local_48;
  slot = local_50;
  pcVar13 = _optarg;
  iVar9 = 1;
  switch(iVar7) {
  case 0x100:
    local_cc = local_cc + 1;
    bVar3 = true;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x101:
    local_68 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x102:
    local_88 = 1;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x103:
    local_58 = CONCAT71((int7)((ulong)((long)&switchD_00111f69::switchdataD_00138004 +
                                      (long)(int)(&switchD_00111f69::switchdataD_00138004)
                                                 [iVar7 - 0x100]) >> 8),1);
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x104:
    goto switchD_00111f69_caseD_104;
  case 0x105:
    local_a0 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x106:
    local_cc = local_cc + 1;
    local_a8 = _optarg;
    bVar6 = true;
    bVar2 = true;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x107:
    iVar7 = strcmp(_optarg,"keypair");
    iVar9 = 0;
    if (iVar7 != 0) {
      iVar7 = strcmp(pcVar13,"aes");
      iVar9 = 1;
      if (iVar7 != 0) {
        iVar7 = strcmp(pcVar13,"cert");
        iVar9 = 2;
        if (iVar7 != 0) {
          fprintf(_stderr,"ERROR: Invalid import type \'%s\'\n",pcVar13);
          iVar9 = iVar12;
        }
      }
    }
    goto switchD_00111f69_caseD_114;
  case 0x108:
    local_cc = local_cc + 1;
    bVar6 = true;
    bVar5 = true;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x109:
    local_c0 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x10a:
    local_80 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x10b:
    local_70 = 1;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x10c:
    local_c8 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x10d:
    local_40 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x10e:
    local_cc = local_cc + 1;
    bVar6 = true;
    bVar1 = true;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x10f:
    iVar9 = strcmp(_optarg,"default-pkcs11-lib");
    if (iVar9 != 0) {
      main_cold_1();
LAB_001123a0:
      usage();
      exit(1);
    }
    pcVar13 = "/usr/local/lib/softhsm/libsofthsm2.so";
    goto LAB_0011238c;
  case 0x110:
    local_50 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x111:
    local_60 = _optarg;
    iVar9 = iVar12;
    goto switchD_00111f69_caseD_114;
  case 0x112:
    break;
  case 0x113:
    goto switchD_00111f69_caseD_113;
  case 0x114:
    goto switchD_00111f69_caseD_114;
  default:
    if (iVar7 == -1) {
      if (local_cc != 1) goto LAB_001123a0;
      if (!bVar6) {
LAB_001121e9:
        if (bVar5) {
          uVar8 = findSlot(slot,serial,token,(bool)((byte)local_58 & 1),&slotID);
          if (uVar8 == 0) {
            uVar8 = initToken(slotID,local_c0,local_60,local_c8);
          }
        }
        else {
          uVar8 = 0;
        }
        if (bVar1 && uVar8 == 0) {
          uVar8 = showSlots();
        }
        if ((bVar2 && uVar8 == 0) && (uVar8 = findSlot(slot,serial,token,&slotID), uVar8 == 0)) {
          if (iVar12 == 2) {
            uVar8 = importCertificate(local_a8,slotID,local_c8,local_c0,local_a0,(int)local_88);
          }
          else if (iVar12 == 1) {
            uVar8 = importSecretKey(local_a8,slotID,local_c8,local_c0,local_a0);
          }
          else {
            uStackY_f0 = 0x1122f7;
            uVar8 = importKeyPair(local_a8,local_68,slotID,local_c8,local_c0,local_a0,(int)local_88,
                                  (int)local_70);
          }
        }
        if (bVar3 && uVar8 == 0) {
          bVar5 = deleteToken(serial,token);
          uVar8 = (uint)!bVar5;
        }
        if (bVar6) {
          (*p11->C_Finalize)((void *)0x0);
          unloadLibrary(moduleHandle);
        }
        return uVar8;
      }
      bVar4 = checkSetup();
      if (bVar4) {
        p_Var10 = loadLibrary(local_80,&moduleHandle,&errMsg);
        if (p_Var10 != (CK_C_GetFunctionList)0x0) {
          (*p_Var10)(&p11);
          CVar11 = (*p11->C_Initialize)((void *)0x0);
          if (CVar11 == 0) goto LAB_001121e9;
          goto LAB_001123c1;
        }
      }
      else {
        main_cold_2();
      }
      main_cold_4();
LAB_001123c1:
      main_cold_3();
      uStackY_f0 = (ulong)(uint)argc;
      bVar6 = initSoftHSM();
      if (bVar6) {
        this = Configuration::i();
        sStackY_178._M_dataplus._M_p = (pointer)&sStackY_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sStackY_178,"directories.tokendir","");
        sStackY_198._M_dataplus._M_p = (pointer)&sStackY_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sStackY_198,"/var/lib/softhsm/tokens/","");
        Configuration::getString(&sStackY_1d8,this,&sStackY_178,&sStackY_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStackY_198._M_dataplus._M_p != &sStackY_198.field_2) {
          operator_delete(sStackY_198._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStackY_178._M_dataplus._M_p != &sStackY_178.field_2) {
          operator_delete(sStackY_178._M_dataplus._M_p);
        }
        sStackY_1b8._M_dataplus._M_p = (pointer)&sStackY_1b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&sStackY_1b8,sStackY_1d8._M_dataplus._M_p,
                   sStackY_1d8._M_dataplus._M_p + sStackY_1d8._M_string_length);
        Directory::Directory(&DStackY_158,&sStackY_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStackY_1b8._M_dataplus._M_p != &sStackY_1b8.field_2) {
          operator_delete(sStackY_1b8._M_dataplus._M_p);
        }
        bVar6 = Directory::isValid(&DStackY_158);
        iVar9 = (int)CONCAT71(extraout_var,bVar6);
        if (!bVar6) {
          checkSetup();
        }
        CryptoFactory::reset();
        SecureMemoryRegistry::reset();
        Directory::~Directory(&DStackY_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStackY_1d8._M_dataplus._M_p != &sStackY_1d8.field_2) {
          operator_delete(sStackY_1d8._M_dataplus._M_p);
        }
      }
      else {
        CryptoFactory::reset();
        SecureMemoryRegistry::reset();
        iVar9 = 0;
      }
      return iVar9;
    }
    if (iVar7 != 0x76) goto switchD_00111f69_caseD_104;
switchD_00111f69_caseD_113:
    pcVar13 = "2.6.1";
LAB_0011238c:
    puts(pcVar13);
    goto LAB_00112391;
  }
  local_48 = _optarg;
  iVar9 = iVar12;
  goto switchD_00111f69_caseD_114;
switchD_00111f69_caseD_104:
  usage();
LAB_00112391:
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
	int option_index = 0;
	int opt;

	char* inPath = NULL;
	char* soPIN = NULL;
	char* userPIN = NULL;
	char* filePIN = NULL;
	char* label = NULL;
	char* module = NULL;
	char* objectID = NULL;
	char* slot = NULL;
	char* serial = NULL;
	char* token = NULL;
	char* errMsg = NULL;
	int forceExec = 0;
	bool freeToken = false;
	int noPublicKey = 0;
	int importType = IMPORT_TYPE_KEYPAIR;

	int doInitToken = 0;
	int doShowSlots = 0;
	int doImport = 0;
	int doDeleteToken = 0;
	int action = 0;
	bool needP11 = false;
	int rv = 0;
	CK_SLOT_ID slotID = 0;

	moduleHandle = NULL;
	p11 = NULL;

	while ((opt = getopt_long(argc, argv, "hv", long_options, &option_index)) != -1)
	{
		switch (opt)
		{
			case OPT_SHOW_SLOTS:
				doShowSlots = 1;
				action++;
				needP11 = true;
				break;
			case OPT_SHOW_CONFIG:
				if (!strcmp(optarg, "default-pkcs11-lib"))
				{
					printf("%s\n", DEFAULT_PKCS11_LIB);
					exit(0);
				}
				else
				{
					fprintf(stderr, "ERROR: Invalid configuration key '%s'\n", optarg);
					exit(1);
				}
				break;
			case OPT_INIT_TOKEN:
				doInitToken = 1;
				action++;
				needP11 = true;
				break;
			case OPT_IMPORT:
				doImport = 1;
				action++;
				inPath = optarg;
				needP11 = true;
				break;
			case OPT_IMPORT_TYPE:
				if (!strcmp(optarg, "keypair"))
					importType = IMPORT_TYPE_KEYPAIR;
				else if (!strcmp(optarg, "aes"))
					importType = IMPORT_TYPE_AES;
				else if (!strcmp(optarg, "cert"))
					importType = IMPORT_TYPE_CERT;
				else
				{
					fprintf(stderr, "ERROR: Invalid import type '%s'\n", optarg);
				}
				break;
			case OPT_AES:
				importType = IMPORT_TYPE_AES;
				break;
			case OPT_DELETE_TOKEN:
				doDeleteToken = 1;
				action++;
				break;
			case OPT_SLOT:
				slot = optarg;
				break;
			case OPT_LABEL:
				label = optarg;
				break;
			case OPT_SERIAL:
				serial = optarg;
				break;
			case OPT_TOKEN:
				token = optarg;
				break;
			case OPT_MODULE:
				module = optarg;
				break;
			case OPT_NO_PUBLIC_KEY:
				noPublicKey = 1;
				break;
			case OPT_ID:
				objectID = optarg;
				break;
			case OPT_SO_PIN:
				soPIN = optarg;
				break;
			case OPT_PIN:
				userPIN = optarg;
				break;
			case OPT_FILE_PIN:
				filePIN = optarg;
				break;
			case OPT_FORCE:
				forceExec = 1;
				break;
			case OPT_FREE:
				freeToken = true;
				break;
			case OPT_VERSION:
			case 'v':
				printf("%s\n", PACKAGE_VERSION);
				exit(0);
				break;
			case OPT_HELP:
			case 'h':
			default:
				usage();
				exit(0);
				break;
		}
	}

	// No action given, display the usage.
	if (action != 1)
	{
		usage();
		exit(1);
	}

	if (needP11)
	{
		// Check the basic setup of SoftHSM
		if (!checkSetup())
		{
			fprintf(stderr, "ERROR: Please verify that the SoftHSM configuration is correct.\n");
			exit(1);
		}

		// Get a pointer to the function list for PKCS#11 library
		CK_C_GetFunctionList pGetFunctionList = loadLibrary(module, &moduleHandle, &errMsg);
		if (!pGetFunctionList)
		{
			fprintf(stderr, "ERROR: Could not load the PKCS#11 library/module: %s\n", errMsg);
			fprintf(stderr, "ERROR: Please check log files for additional information.\n");
			exit(1);
		}

		// Load the function list
		(*pGetFunctionList)(&p11);

		// Initialize the library
		CK_RV p11rv = p11->C_Initialize(NULL_PTR);
		if (p11rv != CKR_OK)
		{
			fprintf(stderr, "ERROR: Could not initialize the PKCS#11 library/module: %s\n", module ? module : DEFAULT_PKCS11_LIB);
			fprintf(stderr, "ERROR: Please check log files for additional information.\n");
			exit(1);
		}
	}

	// We should create the token.
	if (doInitToken)
	{
		// Get the slotID
		rv = findSlot(slot, serial, token, freeToken, slotID);
		if (!rv)
		{
			rv = initToken(slotID, label, soPIN, userPIN);
		}
	}

	// Show all available slots
	if (!rv && doShowSlots)
	{
		rv = showSlots();
	}

	// Import a key pair from the given path
	if (!rv && doImport)
	{
		// Get the slotID
		rv = findSlot(slot, serial, token, slotID);
		if (!rv)
		{
			switch(importType)
			{
				case IMPORT_TYPE_KEYPAIR:
					rv = importKeyPair(inPath, filePIN, slotID, userPIN, label, objectID, forceExec, noPublicKey);
					break;
				case IMPORT_TYPE_AES:
					rv = importSecretKey(inPath, slotID, userPIN, label, objectID);
					break;
				case IMPORT_TYPE_CERT:
					rv = importCertificate(inPath, slotID, userPIN, label, objectID, forceExec);
					break;
				default:
					fprintf(stderr, "Invalid importType %d.\n", importType);
					rv = 1;
					break;
			}
		}
	}

	// We should delete the token.
	if (!rv && doDeleteToken)
	{
		if (deleteToken(serial, token))
		{
			rv = 0;
		}
		else
		{
			rv = 1;
		}
	}

	// Finalize the library
	if (needP11)
	{
		p11->C_Finalize(NULL_PTR);
		unloadLibrary(moduleHandle);
	}

	return rv;
}